

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O1

bool __thiscall
libtorrent::anon_unknown_6::ut_pex_peer_plugin::on_extended
          (ut_pex_peer_plugin *this,int length,int msg,span<const_char> body)

{
  pointer *pppVar1;
  byte bVar2;
  pointer ppVar3;
  pointer ppVar4;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  ushort uVar8;
  rep rVar9;
  rep rVar10;
  rep rVar11;
  rep rVar12;
  undefined1 auVar13 [8];
  anon_union_16_3_a3f0114d_for___in6_u aVar14;
  pointer pbVar15;
  bool bVar16;
  int iVar17;
  type_t tVar18;
  int iVar19;
  uint uVar20;
  torrent_flags_t tVar21;
  _func_int **pp_Var22;
  time_point tVar23;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  _Var24;
  char *pcVar25;
  session_settings *psVar26;
  short *psVar27;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  _Var28;
  undefined4 extraout_var_00;
  undefined8 uVar29;
  long lVar30;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  uint uVar31;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *extraout_RDX_05;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *extraout_RDX_06;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *in;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  bool bVar33;
  peer_connection *ppVar34;
  int iVar35;
  long lVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  value_type v;
  bdecode_node p6f;
  bdecode_node p6;
  char *in_2;
  char *in_1;
  bdecode_node pf;
  bdecode_node p;
  char *in_3;
  bdecode_node pex_msg;
  error_code ec;
  undefined1 local_238 [16];
  ushort local_228;
  undefined6 uStack_226;
  ulong local_220;
  peers4_t *local_218;
  ulong local_210;
  undefined1 local_208 [24];
  bdecode_token *local_1f0;
  char *pcStack_1e8;
  int local_1e0;
  int iStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  int local_1d0;
  undefined1 local_1c0 [8];
  anon_union_16_3_a3f0114d_for___in6_u local_1b8;
  bdecode_token *local_1a8;
  char *pcStack_1a0;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  undefined1 local_180 [32];
  peers4_t *local_160;
  undefined1 local_158 [8];
  anon_union_16_3_a3f0114d_for___in6_u aStack_150;
  ulong local_140;
  undefined1 local_138 [32];
  char *pcStack_118;
  int local_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  int local_100;
  error_code local_f0;
  pointer pbStack_e0;
  bdecode_token *local_d8;
  char *pcStack_d0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  value_type local_b0;
  peers6_t *local_98;
  char *local_90;
  error_code local_88;
  pointer local_78;
  undefined4 uStack_70;
  undefined4 local_6c;
  undefined1 auStack_68 [12];
  int local_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  error_code local_40;
  undefined4 extraout_var;
  char **ppcVar32;
  
  bVar37 = this->m_message_index != 0;
  bVar33 = bVar37 && msg == 1;
  if (!bVar37 || msg != 1) {
    return bVar33;
  }
  tVar21 = aux::torrent::flags(this->m_torrent);
  if (((uint)tVar21.m_val >> 0x15 & 1) != 0) {
    return bVar33;
  }
  if (0x7d000 < length) {
    ppVar34 = this->m_pc;
    local_88 = errors::make_error_code(pex_message_too_large);
    pp_Var22 = (ppVar34->super_bandwidth_socket)._vptr_bandwidth_socket;
    uVar29 = 2;
LAB_003aa53b:
    (*pp_Var22[0x14])(ppVar34,&local_88,1,uVar29);
    return bVar33;
  }
  if ((int)body.m_len < length) {
    return bVar33;
  }
  tVar23 = aux::time_now();
  if ((long)tVar23.__d.__r + -60000000000 < this->m_last_pex[0].__d.__r) {
    ppVar34 = this->m_pc;
    local_88 = errors::make_error_code(too_frequent_pex);
    pp_Var22 = (ppVar34->super_bandwidth_socket)._vptr_bandwidth_socket;
    uVar29 = 0;
    goto LAB_003aa53b;
  }
  rVar9 = this->m_last_pex[1].__d.__r;
  rVar10 = this->m_last_pex[2].__d.__r;
  rVar11 = this->m_last_pex[3].__d.__r;
  rVar12 = this->m_last_pex[4].__d.__r;
  this->m_last_pex[4].__d.__r = this->m_last_pex[5].__d.__r;
  this->m_last_pex[2].__d.__r = rVar11;
  this->m_last_pex[3].__d.__r = rVar12;
  this->m_last_pex[0].__d.__r = rVar9;
  this->m_last_pex[1].__d.__r = rVar10;
  this->m_last_pex[5].__d.__r = (rep)tVar23.__d.__r;
  auStack_68 = SUB1612((undefined1  [16])0x0,4);
  local_78 = (pointer)0x0;
  uStack_70 = 0;
  local_6c = 0;
  local_88.val_ = 0;
  local_88.failed_ = false;
  local_88._5_3_ = 0;
  local_88.cat_ = (error_category *)0x0;
  local_5c = -1;
  iStack_58 = -1;
  iStack_54 = -1;
  iStack_50 = -1;
  local_40.val_ = 0;
  local_40.failed_ = false;
  local_40.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  iVar17 = bdecode(body.m_ptr,body.m_ptr + body.m_len,(bdecode_node *)&local_88,&local_40,(int *)0x0
                   ,100,2000000);
  if ((iVar17 != 0) || (tVar18 = bdecode_node::type((bdecode_node *)&local_88), tVar18 != dict_t)) {
    ppVar34 = this->m_pc;
    local_f0 = errors::make_error_code(invalid_pex_message);
    (*(ppVar34->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar34,&local_f0,1,2);
    goto LAB_003aabd8;
  }
  key._M_str = "dropped";
  key._M_len = 7;
  bdecode_node::dict_find_string((bdecode_node *)&local_f0,(bdecode_node *)&local_88,key);
  bVar37 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_f0);
  local_210 = 0;
  if (bVar37) {
    iVar17 = bdecode_node::string_length((bdecode_node *)&local_f0);
    local_210 = (ulong)(uint)(iVar17 / 6);
  }
  bVar37 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_f0);
  if (bVar37) {
    iVar17 = bdecode_node::string_length((bdecode_node *)&local_f0);
    local_208._0_8_ = bdecode_node::string_ptr((bdecode_node *)&local_f0);
    if (5 < iVar17) {
      iVar17 = iVar17 / 6;
      local_218 = &(this->super_ut_pex_peer_store).m_peers;
      ppcVar32 = extraout_RDX;
      do {
        aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                  ((basic_endpoint<boost::asio::ip::tcp> *)local_138,(aux *)local_208,ppcVar32);
        if (local_138._0_2_ != 2) {
          local_1c0 = (undefined1  [8])&PTR__bad_cast_004ee530;
          boost::throw_exception<boost::asio::ip::bad_address_cast>((bad_address_cast *)local_1c0);
        }
        local_238._4_2_ = local_138._2_2_ << 8 | (ushort)local_138._2_2_ >> 8;
        local_238._0_4_ = local_138._4_4_;
        _Var24 = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_238);
        ppcVar32 = extraout_RDX_00;
        if (((_Var24._M_current !=
              (this->super_ut_pex_peer_store).m_peers.
              super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) &&
            (*(int *)((_Var24._M_current)->first)._M_elems == local_238._0_4_)) &&
           ((_Var24._M_current)->second == local_238._4_2_)) {
          ::std::
          vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
          ::erase(local_218,(const_iterator)_Var24._M_current);
          ppcVar32 = extraout_RDX_01;
        }
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
    }
  }
  key_00._M_str = "added";
  key_00._M_len = 5;
  bdecode_node::dict_find_string((bdecode_node *)local_138,(bdecode_node *)&local_88,key_00);
  pbVar15 = pbStack_e0;
  uVar29 = local_f0._0_8_;
  local_f0.cat_ = (error_category *)local_138._8_8_;
  local_f0.val_ = local_138._0_4_;
  local_f0.failed_ = (bool)local_138[4];
  local_f0._5_3_ = local_138._5_3_;
  pbStack_e0 = (pointer)local_138._16_8_;
  local_138._0_8_ = (void *)0x0;
  local_138[8] = '\0';
  local_138[9] = '\0';
  local_138[10] = '\0';
  local_138[0xb] = '\0';
  local_138[0xc] = '\0';
  local_138[0xd] = '\0';
  local_138[0xe] = '\0';
  local_138[0xf] = '\0';
  local_138._16_8_ = (pointer)0x0;
  if ((pointer)uVar29 != (pointer)0x0) {
    operator_delete((void *)uVar29,(long)pbVar15 - uVar29);
  }
  local_b8 = local_100;
  local_c8 = local_110;
  iStack_c4 = iStack_10c;
  iStack_c0 = iStack_108;
  iStack_bc = iStack_104;
  local_d8 = (bdecode_token *)local_138._24_8_;
  pcStack_d0 = pcStack_118;
  if ((void *)local_138._0_8_ != (void *)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  key_01._M_str = "added.f";
  key_01._M_len = 7;
  bdecode_node::dict_find_string((bdecode_node *)local_138,(bdecode_node *)&local_88,key_01);
  bVar37 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_f0);
  local_218 = (peers4_t *)0x0;
  if (bVar37) {
    iVar17 = bdecode_node::string_length((bdecode_node *)&local_f0);
    local_218 = (peers4_t *)(ulong)(uint)(iVar17 / 6);
  }
  bVar37 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_f0);
  if ((bVar37) && (bVar37 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_138), bVar37))
  {
    iVar17 = bdecode_node::string_length((bdecode_node *)local_138);
    iVar19 = bdecode_node::string_length((bdecode_node *)&local_f0);
    if (iVar17 != iVar19 / 6) goto LAB_003aac09;
    iVar17 = bdecode_node::string_length((bdecode_node *)local_138);
    local_158 = (undefined1  [8])bdecode_node::string_ptr((bdecode_node *)&local_f0);
    pcVar25 = bdecode_node::string_ptr((bdecode_node *)local_138);
    if (iVar17 < 1) goto LAB_003aac09;
    local_160 = &(this->super_ut_pex_peer_store).m_peers;
    lVar36 = 0;
    bVar37 = false;
    ppcVar32 = extraout_RDX_02;
    do {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)local_238,(aux *)local_158,ppcVar32);
      bVar2 = pcVar25[lVar36];
      ppVar3 = (this->super_ut_pex_peer_store).m_peers.
               super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar4 = (this->super_ut_pex_peer_store).m_peers.
               super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar26 = aux::torrent::settings(this->m_torrent);
      uVar20 = aux::session_settings::get_int(psVar26,0x404b);
      iVar35 = (int)((ulong)((long)ppVar3 - (long)ppVar4) >> 1);
      uVar31 = iVar35 * -0x55555555;
      ppcVar32 = (char **)(ulong)uVar31;
      iVar19 = 8;
      if (uVar20 != uVar31 && SBORROW4(uVar20,uVar31) == (int)(uVar20 + iVar35 * 0x55555555) < 0) {
        if (local_238._0_2_ == 2) {
          local_1c0 = (undefined1  [8])(local_238._0_8_ & 0xffffffff00000000);
          local_1b8 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
          local_1a8 = (bdecode_token *)0x0;
        }
        else {
          local_1b8 = (anon_union_16_3_a3f0114d_for___in6_u)stack0xfffffffffffffdd0;
          local_1a8 = (bdecode_token *)(local_220 & 0xffffffff);
          local_1c0 = (undefined1  [8])0x1;
        }
        bVar16 = aux::is_local((address *)local_1c0);
        if (bVar16) {
          iVar19 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
          psVar27 = (short *)CONCAT44(extraout_var,iVar19);
          if (*psVar27 == 2) {
            local_208._0_8_ = (ulong)*(uint *)(psVar27 + 2) << 0x20;
            local_208._8_16_ = (undefined1  [16])0x0;
            local_1f0 = (bdecode_token *)0x0;
          }
          else {
            local_208._8_16_ = *(undefined1 (*) [16])(psVar27 + 4);
            local_1f0 = (bdecode_token *)(ulong)*(uint *)(psVar27 + 0xc);
            local_208._0_8_ = (pointer)0x1;
          }
          bVar16 = aux::is_local((address *)local_208);
          iVar19 = 10;
          ppcVar32 = extraout_RDX_03;
          if (!bVar16) goto LAB_003aab8c;
        }
        if (local_238._0_2_ == 2) {
          local_1c0 = (undefined1  [8])(local_238._0_8_ & 0xffffffff00000000);
          local_1b8 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
          local_1a8 = (bdecode_token *)0x0;
        }
        else {
          local_1b8 = (anon_union_16_3_a3f0114d_for___in6_u)stack0xfffffffffffffdd0;
          local_1a8 = (bdecode_token *)(local_220 & 0xffffffff);
          local_1c0 = (undefined1  [8])0x1;
        }
        boost::asio::ip::address::to_v4((address *)local_180);
        local_208._4_2_ = local_238._2_2_ << 8 | (ushort)local_238._2_2_ >> 8;
        local_208._0_4_ = local_180._0_4_;
        _Var24 = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_208);
        if ((_Var24._M_current !=
             (this->super_ut_pex_peer_store).m_peers.
             super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (*&((_Var24._M_current)->first)._M_elems == (_Type)local_208._0_4_)) {
          ppcVar32 = (char **)(ulong)(ushort)local_208._4_2_;
          iVar19 = 10;
          if ((_Var24._M_current)->second == local_208._4_2_) goto LAB_003aab8c;
        }
        ::std::
        vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
        ::insert(local_160,(const_iterator)_Var24._M_current,(value_type *)local_208);
        aux::torrent::add_peer
                  (this->m_torrent,(endpoint *)local_238,(peer_source_flags_t)0x4,
                   (pex_flags_t)(bVar2 & 0x7f));
        iVar19 = 0;
        bVar37 = true;
        ppcVar32 = extraout_RDX_04;
      }
LAB_003aab8c:
    } while (((iVar19 == 10) || (iVar19 == 0)) && (lVar36 = lVar36 + 1, iVar17 != (int)lVar36));
  }
  else {
LAB_003aac09:
    bVar37 = false;
  }
  key_02._M_str = "dropped6";
  key_02._M_len = 8;
  bdecode_node::dict_find_string((bdecode_node *)local_1c0,(bdecode_node *)&local_88,key_02);
  bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1c0);
  if (bVar16) {
    iVar17 = bdecode_node::string_length((bdecode_node *)local_1c0);
    iVar19 = bdecode_node::string_length((bdecode_node *)local_1c0);
    local_180._0_8_ = bdecode_node::string_ptr((bdecode_node *)local_1c0);
    if (0x11 < iVar19) {
      iVar35 = 0;
      in = extraout_RDX_05;
      do {
        aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                  ((basic_endpoint<boost::asio::ip::tcp> *)local_208,(aux *)local_180,(char **)in);
        if (local_208._0_2_ == 2) {
          local_158 = (undefined1  [8])&PTR__bad_cast_004ee530;
          boost::throw_exception<boost::asio::ip::bad_address_cast>((bad_address_cast *)local_158);
        }
        local_238._0_8_ = local_208._8_8_;
        local_228 = local_208._2_2_ << 8 | (ushort)local_208._2_2_ >> 8;
        local_238._8_8_ = local_208._16_8_;
        _Var28 = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->super_ut_pex_peer_store).m_peers6.
                            super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->super_ut_pex_peer_store).m_peers6.
                            super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_238);
        ppVar5 = (this->super_ut_pex_peer_store).m_peers6.
                 super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        in = extraout_RDX_06;
        if (_Var28._M_current != ppVar5) {
          auVar38[0] = -(local_238[0] == ((_Var28._M_current)->first)._M_elems[0]);
          auVar38[1] = -(local_238[1] == ((_Var28._M_current)->first)._M_elems[1]);
          auVar38[2] = -(local_238[2] == ((_Var28._M_current)->first)._M_elems[2]);
          auVar38[3] = -(local_238[3] == ((_Var28._M_current)->first)._M_elems[3]);
          auVar38[4] = -(local_238[4] == ((_Var28._M_current)->first)._M_elems[4]);
          auVar38[5] = -(local_238[5] == ((_Var28._M_current)->first)._M_elems[5]);
          auVar38[6] = -(local_238[6] == ((_Var28._M_current)->first)._M_elems[6]);
          auVar38[7] = -(local_238[7] == ((_Var28._M_current)->first)._M_elems[7]);
          auVar38[8] = -(local_238[8] == ((_Var28._M_current)->first)._M_elems[8]);
          auVar38[9] = -(local_238[9] == ((_Var28._M_current)->first)._M_elems[9]);
          auVar38[10] = -(local_238[10] == ((_Var28._M_current)->first)._M_elems[10]);
          auVar38[0xb] = -(local_238[0xb] == ((_Var28._M_current)->first)._M_elems[0xb]);
          auVar38[0xc] = -(local_238[0xc] == ((_Var28._M_current)->first)._M_elems[0xc]);
          auVar38[0xd] = -(local_238[0xd] == ((_Var28._M_current)->first)._M_elems[0xd]);
          auVar38[0xe] = -(local_238[0xe] == ((_Var28._M_current)->first)._M_elems[0xe]);
          auVar38[0xf] = -(local_238[0xf] == ((_Var28._M_current)->first)._M_elems[0xf]);
          uVar8 = (ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar38[0xf] >> 7) << 0xf;
          in = (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)(ulong)uVar8;
          if (uVar8 == 0xffff) {
            in = (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)(ulong)local_228;
            if ((_Var28._M_current)->second == local_228) {
              in = _Var28._M_current + 1;
              if ((in != ppVar5) && (0 < (long)ppVar5 - (long)in)) {
                in = (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                     ((ulong)((long)ppVar5 - (long)in) / 0x12 + 1);
                do {
                  uVar29 = *(undefined8 *)(_Var28._M_current[1].first._M_elems + 8);
                  *(undefined8 *)((_Var28._M_current)->first)._M_elems =
                       *(undefined8 *)_Var28._M_current[1].first._M_elems;
                  *(undefined8 *)(((_Var28._M_current)->first)._M_elems + 8) = uVar29;
                  (_Var28._M_current)->second = _Var28._M_current[1].second;
                  _Var28._M_current = _Var28._M_current + 1;
                  in = (pair<std::array<unsigned_char,_16UL>,_unsigned_short> *)
                       ((long)&in[-1].second + 1);
                } while (1 < (long)in);
              }
              pppVar1 = &(this->super_ut_pex_peer_store).m_peers6.
                         super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + -1;
            }
          }
        }
        iVar35 = iVar35 + 1;
      } while (iVar35 != iVar19 / 0x12);
    }
    local_210 = (ulong)(uint)(iVar17 / 0x12 + (int)local_210);
  }
  key_03._M_str = "added6";
  key_03._M_len = 6;
  bdecode_node::dict_find_string((bdecode_node *)local_208,(bdecode_node *)&local_88,key_03);
  auVar13 = local_1c0;
  uVar29 = local_1b8._8_8_;
  local_1c0 = (undefined1  [8])local_208._0_8_;
  local_1b8 = (anon_union_16_3_a3f0114d_for___in6_u)local_208._8_16_;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_16_ = ZEXT816(0);
  if ((bad_address_cast)auVar13 != (bad_address_cast)0x0) {
    operator_delete((void *)auVar13,uVar29 - (long)auVar13);
  }
  local_188 = local_1d0;
  local_198 = local_1e0;
  iStack_194 = iStack_1dc;
  iStack_190 = iStack_1d8;
  iStack_18c = iStack_1d4;
  local_1a8 = local_1f0;
  pcStack_1a0 = pcStack_1e8;
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
  }
  bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1c0);
  if (bVar16) {
    iVar17 = bdecode_node::string_length((bdecode_node *)local_1c0);
    local_218 = (peers4_t *)(ulong)(uint)(iVar17 / 0x12 + (int)local_218);
  }
  key_04._M_str = "added6.f";
  key_04._M_len = 8;
  bdecode_node::dict_find_string((bdecode_node *)local_208,(bdecode_node *)&local_88,key_04);
  bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1c0);
  if ((bVar16) && (bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_208), bVar16))
  {
    iVar17 = bdecode_node::string_length((bdecode_node *)local_208);
    iVar19 = bdecode_node::string_length((bdecode_node *)local_1c0);
    if (iVar17 == iVar19 / 0x12) {
      iVar17 = bdecode_node::string_length((bdecode_node *)local_208);
      local_90 = bdecode_node::string_ptr((bdecode_node *)local_1c0);
      local_160 = (peers4_t *)bdecode_node::string_ptr((bdecode_node *)local_208);
      if (0 < iVar17) {
        local_98 = &(this->super_ut_pex_peer_store).m_peers6;
        lVar36 = 0;
        ppcVar32 = extraout_RDX_07;
        do {
          aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                    ((basic_endpoint<boost::asio::ip::tcp> *)local_180,(aux *)&local_90,ppcVar32);
          bVar2 = *(byte *)((long)&(local_160->
                                   super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar36);
          if (local_180._0_2_ == 2) {
            local_238._0_8_ = local_180._0_8_ & 0xffffffff00000000;
            stack0xfffffffffffffdd0 = (undefined1  [16])0x0;
            local_220 = 0;
          }
          else {
            _local_228 = local_180._16_8_;
            local_238._8_8_ = local_180._8_8_;
            local_220 = (ulong)(uint)local_180._24_4_;
            local_238._0_8_ = 1;
          }
          bVar16 = aux::is_local((address *)local_238);
          if (bVar16) {
            iVar19 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
            psVar27 = (short *)CONCAT44(extraout_var_00,iVar19);
            if (*psVar27 == 2) {
              local_158 = (undefined1  [8])((ulong)*(uint *)(psVar27 + 2) << 0x20);
              aStack_150 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
              local_140 = 0;
            }
            else {
              aStack_150 = *(anon_union_16_3_a3f0114d_for___in6_u *)(psVar27 + 4);
              local_140 = (ulong)*(uint *)(psVar27 + 0xc);
              local_158 = (undefined1  [8])0x1;
            }
            bVar16 = aux::is_local((address *)local_158);
            lVar30 = 0;
            ppcVar32 = extraout_RDX_08;
            if (bVar16) goto LAB_003ab05d;
          }
          else {
LAB_003ab05d:
            ppVar6 = (this->super_ut_pex_peer_store).m_peers6.
                     super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppVar7 = (this->super_ut_pex_peer_store).m_peers6.
                     super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar26 = aux::torrent::settings(this->m_torrent);
            uVar20 = aux::session_settings::get_int(psVar26,0x404b);
            iVar19 = (int)((ulong)((long)ppVar6 - (long)ppVar7) >> 1);
            uVar31 = iVar19 * 0x38e38e39;
            ppcVar32 = (char **)(ulong)uVar31;
            lVar30 = 0xe;
            if (uVar20 != uVar31 &&
                SBORROW4(uVar20,uVar31) == (int)(uVar20 + iVar19 * -0x38e38e39) < 0) {
              if (local_180._0_2_ == 2) {
                local_238._0_8_ = local_180._0_8_ & 0xffffffff00000000;
                stack0xfffffffffffffdd0 = (undefined1  [16])0x0;
                local_220 = 0;
              }
              else {
                _local_228 = local_180._16_8_;
                local_238._8_8_ = local_180._8_8_;
                local_220 = (ulong)(uint)local_180._24_4_;
                local_238._0_8_ = 1;
              }
              boost::asio::ip::address::to_v6((address_v6 *)local_158,(address *)local_238);
              aVar14 = aStack_150;
              local_b0.second = local_180._2_2_ << 8 | (ushort)local_180._2_2_ >> 8;
              local_b0.first._M_elems[0] = local_158[0];
              local_b0.first._M_elems[1] = local_158[1];
              local_b0.first._M_elems[2] = local_158[2];
              local_b0.first._M_elems[3] = local_158[3];
              local_b0.first._M_elems[4] = local_158[4];
              local_b0.first._M_elems[5] = local_158[5];
              local_b0.first._M_elems[6] = local_158[6];
              local_b0.first._M_elems[7] = local_158[7];
              local_b0.first._M_elems[8] = aStack_150.__u6_addr8[0];
              local_b0.first._M_elems[9] = aStack_150.__u6_addr8[1];
              local_b0.first._M_elems[10] = aStack_150.__u6_addr8[2];
              local_b0.first._M_elems[0xb] = aStack_150.__u6_addr8[3];
              local_b0.first._M_elems[0xc] = aStack_150.__u6_addr8[4];
              local_b0.first._M_elems[0xd] = aStack_150.__u6_addr8[5];
              local_b0.first._M_elems[0xe] = aStack_150.__u6_addr8[6];
              local_b0.first._M_elems[0xf] = aStack_150.__u6_addr8[7];
              aStack_150 = aVar14;
              _Var28 = ::std::
                       __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                                 ((this->super_ut_pex_peer_store).m_peers6.
                                  super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (this->super_ut_pex_peer_store).m_peers6.
                                  super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_b0);
              if (_Var28._M_current !=
                  (this->super_ut_pex_peer_store).m_peers6.
                  super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                auVar39[0] = -(local_b0.first._M_elems[0] ==
                              ((_Var28._M_current)->first)._M_elems[0]);
                auVar39[1] = -(local_b0.first._M_elems[1] ==
                              ((_Var28._M_current)->first)._M_elems[1]);
                auVar39[2] = -(local_b0.first._M_elems[2] ==
                              ((_Var28._M_current)->first)._M_elems[2]);
                auVar39[3] = -(local_b0.first._M_elems[3] ==
                              ((_Var28._M_current)->first)._M_elems[3]);
                auVar39[4] = -(local_b0.first._M_elems[4] ==
                              ((_Var28._M_current)->first)._M_elems[4]);
                auVar39[5] = -(local_b0.first._M_elems[5] ==
                              ((_Var28._M_current)->first)._M_elems[5]);
                auVar39[6] = -(local_b0.first._M_elems[6] ==
                              ((_Var28._M_current)->first)._M_elems[6]);
                auVar39[7] = -(local_b0.first._M_elems[7] ==
                              ((_Var28._M_current)->first)._M_elems[7]);
                auVar39[8] = -(local_b0.first._M_elems[8] ==
                              ((_Var28._M_current)->first)._M_elems[8]);
                auVar39[9] = -(local_b0.first._M_elems[9] ==
                              ((_Var28._M_current)->first)._M_elems[9]);
                auVar39[10] = -(local_b0.first._M_elems[10] ==
                               ((_Var28._M_current)->first)._M_elems[10]);
                auVar39[0xb] = -(local_b0.first._M_elems[0xb] ==
                                ((_Var28._M_current)->first)._M_elems[0xb]);
                auVar39[0xc] = -(local_b0.first._M_elems[0xc] ==
                                ((_Var28._M_current)->first)._M_elems[0xc]);
                auVar39[0xd] = -(local_b0.first._M_elems[0xd] ==
                                ((_Var28._M_current)->first)._M_elems[0xd]);
                auVar39[0xe] = -(local_b0.first._M_elems[0xe] ==
                                ((_Var28._M_current)->first)._M_elems[0xe]);
                auVar39[0xf] = -(local_b0.first._M_elems[0xf] ==
                                ((_Var28._M_current)->first)._M_elems[0xf]);
                if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar39[0xf] >> 7) << 0xf) == 0xffff) {
                  ppcVar32 = (char **)(ulong)local_b0.second;
                  lVar30 = 0;
                  if ((_Var28._M_current)->second == local_b0.second) goto LAB_003ab1ad;
                }
              }
              ::std::
              vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
              ::insert(local_98,(const_iterator)_Var28._M_current,&local_b0);
              aux::torrent::add_peer
                        (this->m_torrent,(endpoint *)local_180,(peer_source_flags_t)0x4,
                         (pex_flags_t)(bVar2 & 0x7f));
              lVar30 = 0;
              bVar37 = true;
              ppcVar32 = extraout_RDX_09;
            }
          }
LAB_003ab1ad:
        } while ((lVar30 == 0) && (lVar36 = lVar36 + 1, iVar17 != (int)lVar36));
      }
    }
  }
  aux::peer_connection::peer_log
            (this->m_pc,incoming_message,"PEX","dropped: %d added: %d",local_210,local_218);
  counters::inc_stats_counter(this->m_pc->m_counters,0x52,1);
  if (bVar37) {
    aux::torrent::do_connect_boost(this->m_torrent);
  }
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
  }
  if ((bad_address_cast)local_1c0 != (bad_address_cast)0x0) {
    operator_delete((void *)local_1c0,local_1b8._8_8_ - (long)local_1c0);
  }
  if ((void *)local_138._0_8_ != (void *)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  if ((pointer)local_f0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f0._0_8_,(long)pbStack_e0 - local_f0._0_8_);
  }
LAB_003aabd8:
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  return bVar33;
}

Assistant:

bool on_extended(int const length, int const msg, span<char const> body) override
		{
			if (msg != extension_index) return false;
			if (m_message_index == 0) return false;

			if (m_torrent.flags() & torrent_flags::disable_pex) return true;

			if (length > 500 * 1024)
			{
				m_pc.disconnect(errors::pex_message_too_large, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			if (int(body.size()) < length) return true;

			time_point const now = aux::time_now();
			if (now - seconds(60) <  m_last_pex[0])
			{
				// this client appears to be trying to flood us
				// with pex messages. Don't allow that.
				m_pc.disconnect(errors::too_frequent_pex, operation_t::bittorrent);
				return true;
			}

			int const num_pex_timers = sizeof(m_last_pex) / sizeof(m_last_pex[0]);
			for (int i = 0; i < num_pex_timers - 1; ++i)
				m_last_pex[i] = m_last_pex[i + 1];
			m_last_pex[num_pex_timers - 1] = now;

			bdecode_node pex_msg;
			error_code ec;
			int const ret = bdecode(body.begin(), body.end(), pex_msg, ec);
			if (ret != 0 || pex_msg.type() != bdecode_node::dict_t)
			{
				m_pc.disconnect(errors::invalid_pex_message, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			bdecode_node p = pex_msg.dict_find_string("dropped");

#ifndef TORRENT_DISABLE_LOGGING
			int num_dropped = 0;
			int num_added = 0;
			if (p) num_dropped += p.string_length() / 6;
#endif
			if (p)
			{
				int const num_peers = p.string_length() / 6;
				char const* in = p.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					if (j != m_peers.end() && *j == v) m_peers.erase(j);
				}
			}

			p = pex_msg.dict_find_string("added");
			bdecode_node const pf = pex_msg.dict_find_string("added.f");

			bool peers_added = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (p) num_added += p.string_length() / 6;
#endif
			if (p && pf && pf.string_length() == p.string_length() / 6)
			{
				int const num_peers = pf.string_length();
				char const* in = p.string_ptr();
				char const* fin = pf.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					if (int(m_peers.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;

					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					// do we already know about this peer?
					if (j != m_peers.end() && *j == v) continue;
					m_peers.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}

			bdecode_node p6 = pex_msg.dict_find_string("dropped6");
			if (p6)
			{
#ifndef TORRENT_DISABLE_LOGGING
				num_dropped += p6.string_length() / 18;
#endif
				int const num_peers = p6.string_length() / 18;
				char const* in = p6.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					if (j != m_peers6.end() && *j == v) m_peers6.erase(j);
				}
			}

			p6 = pex_msg.dict_find_string("added6");
#ifndef TORRENT_DISABLE_LOGGING
			if (p6) num_added += p6.string_length() / 18;
#endif
			bdecode_node const p6f = pex_msg.dict_find_string("added6.f");
			if (p6 && p6f && p6f.string_length() == p6.string_length() / 18)
			{
				int const num_peers = p6f.string_length();
				char const* in = p6.string_ptr();
				char const* fin = p6f.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;
					if (int(m_peers6.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					// do we already know about this peer?
					if (j != m_peers6.end() && *j == v) continue;
					m_peers6.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}
#ifndef TORRENT_DISABLE_LOGGING
			m_pc.peer_log(peer_log_alert::incoming_message, "PEX", "dropped: %d added: %d"
				, num_dropped, num_added);
#endif

			m_pc.stats_counters().inc_stats_counter(counters::num_incoming_pex);

			if (peers_added) m_torrent.do_connect_boost();
			return true;
		}